

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_writer_example.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int counter;
  int iVar2;
  allocator local_2b8 [8];
  stringstream ss;
  ostream local_2a8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  MySharedMemory sharedMemory;
  string message_start;
  undefined1 local_58 [8];
  string message;
  
  std::__cxx11::string::string
            ((string *)(message_start.field_2._M_local_buf + 8),"shared_memory_example",local_2b8);
  MySharedMemory::MySharedMemory
            ((MySharedMemory *)local_f0,(string *)((long)&message_start.field_2 + 8));
  std::__cxx11::string::~string((string *)(message_start.field_2._M_local_buf + 8));
  bVar1 = MySharedMemory::create((MySharedMemory *)local_f0,0x1000);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cout,(string *)&sharedMemory.sem);
    MySharedMemory::~MySharedMemory((MySharedMemory *)local_f0);
    return 1;
  }
  message.field_2._8_8_ = MySharedMemory::data((MySharedMemory *)local_f0);
  std::__cxx11::string::string
            ((string *)(sharedMemory.error_message.field_2._M_local_buf + 8),"Message number: ",
             local_2b8);
  iVar2 = 0;
  do {
    MySharedMemory::lock((MySharedMemory *)local_f0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
    std::ostream::operator<<(local_2a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sharedMemory.error_message.field_2 + 8),&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_130,"\n");
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    if (message._M_dataplus._M_p + 1 != (pointer)0x0) {
      memmove((void *)message.field_2._8_8_,(void *)local_58,(size_t)(message._M_dataplus._M_p + 1))
      ;
    }
    MySharedMemory::unlock((MySharedMemory *)local_f0);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int main() {
    size_t size = 4096;

    MySharedMemory sharedMemory("shared_memory_example");
    bool res = sharedMemory.create(size);
    if (!res) {
        std::cout << sharedMemory.error_message;
        return 1;
    }

    char *data = (char *)sharedMemory.data();

    std::string message_start = "Message number: ";
    for(int counter = 0;; ++counter) {
        sharedMemory.lock();

        std::stringstream ss;
        ss << counter;

        std::string message = message_start + ss.str() + "\n";
        std::copy(&message[0], &message[0] + message.size() + 1, data);

        sharedMemory.unlock();
    }

    return 0;
}